

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::connect
          (NetworkAddressHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint *puVar1;
  long lVar2;
  AsyncIoStream *pAVar3;
  RefcountedClient *pRVar4;
  void *pvVar5;
  Timer *pTVar6;
  HttpHeaderTable *pHVar7;
  Refcounted *refcounted_1;
  undefined1 *in_R9;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>_>
  *location;
  ConnectRequest request;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  local_80;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  local_70;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_48;
  undefined1 local_40;
  Maybe<kj::EntropySource_&> local_38;
  
  getClient((NetworkAddressHttpClient *)&refcounted);
  pRVar4 = refcounted.ptr;
  local_40 = *in_R9;
  local_38.ptr = *(EntropySource **)(in_R9 + 8);
  HttpClientImpl::connect
            ((HttpClientImpl *)&request,(int)((refcounted.ptr)->client).ptr,__addr,__len);
  puVar1 = &((refcounted.ptr)->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_58.disposer = (Disposer *)refcounted.ptr;
  local_80.disposer = (Disposer *)refcounted.ptr;
  local_80.ptr = refcounted.ptr;
  local_58.ptr = (RefcountedClient *)0x0;
  lVar2 = *(long *)((long)request.status.super_PromiseBase.node.ptr + 8);
  if (lVar2 == 0 || (ulong)((long)request.status.super_PromiseBase.node.ptr - lVar2) < 0x28) {
    pvVar5 = operator_new(0x400);
    location = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>_>
                *)((long)pvVar5 + 0x3d8);
    ctor<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&request,&local_80);
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(undefined8 *)((long)request.status.super_PromiseBase.node.ptr + 8) = 0;
    location = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>_>
                *)((long)request.status.super_PromiseBase.node.ptr + -0x28);
    ctor<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&request,&local_80);
    *(long *)((long)request.status.super_PromiseBase.node.ptr + -0x20) = lVar2;
  }
  local_70.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>_>
                  *)0x0;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)location;
  local_48.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_48);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_70);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            (&local_80);
  pAVar3 = request.connection.ptr;
  pTVar6 = (Timer *)operator_new(0x28);
  refcounted.ptr = (RefcountedClient *)0x0;
  pTVar6[1].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)refcounted.disposer;
  pTVar6[2].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)pRVar4;
  pTVar6[3].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)request.connection.disposer;
  pTVar6[4].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)request.connection.ptr;
  request.connection.ptr = (AsyncIoStream *)0x0;
  (pTVar6->super_MonotonicClock)._vptr_MonotonicClock = (_func_int **)&PTR_disposeImpl_00592938;
  pHVar7 = (HttpHeaderTable *)0x1;
  if (pAVar3 != (AsyncIoStream *)0x0) {
    pHVar7 = (HttpHeaderTable *)pAVar3;
  }
  this->timer = pTVar6;
  this->responseHeaderTable = pHVar7;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            (&local_58);
  HttpClient::ConnectRequest::~ConnectRequest(&request);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            (&refcounted);
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    auto refcounted = getClient();
    auto request = refcounted->client->connect(host, headers, settings);
    return ConnectRequest {
      request.status.attach(kj::addRef(*refcounted)),
      request.connection.attach(kj::mv(refcounted))
    };
  }